

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

void __thiscall wasm::LocalGraph::LocalGraph(LocalGraph *this,Function *func,Module *module)

{
  _Rb_tree_header *p_Var1;
  undefined1 local_370 [8];
  LocalGraphFlower flower;
  
  (this->super_LocalGraphBase).func = func;
  (this->super_LocalGraphBase).module = module;
  p_Var1 = &(this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_LocalGraphBase).SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->locations)._M_t._M_impl.super__Rb_tree_header;
  (this->locations)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->locations)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->locations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->locations)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->locations)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->getSetsMap)._M_h._M_buckets = &(this->getSetsMap)._M_h._M_single_bucket;
  (this->getSetsMap)._M_h._M_bucket_count = 1;
  (this->getSetsMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->getSetsMap)._M_h._M_element_count = 0;
  (this->getSetsMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->getSetsMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->getSetsMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->setInfluences)._M_h._M_buckets = &(this->setInfluences)._M_h._M_single_bucket;
  (this->setInfluences)._M_h._M_bucket_count = 1;
  (this->setInfluences)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->setInfluences)._M_h._M_element_count = 0;
  (this->setInfluences)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->setInfluences)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->setInfluences)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->getInfluences)._M_h._M_buckets = &(this->getInfluences)._M_h._M_single_bucket;
  (this->getInfluences)._M_h._M_bucket_count = 1;
  (this->getInfluences)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->getInfluences)._M_h._M_element_count = 0;
  (this->getInfluences)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->getInfluences)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->getInfluences)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LocalGraphFlower::LocalGraphFlower
            ((LocalGraphFlower *)local_370,&this->getSetsMap,&this->locations,func,module,
             (optional<wasm::Expression::Id>)0x0);
  LocalGraphFlower::flow((LocalGraphFlower *)local_370);
  LocalGraphFlower::~LocalGraphFlower((LocalGraphFlower *)local_370);
  return;
}

Assistant:

LocalGraph::LocalGraph(Function* func, Module* module)
  : LocalGraphBase(func, module) {
  // See comment on the declaration of this field for why we use a raw
  // allocation.
  LocalGraphFlower flower(getSetsMap, locations, func, module);
  flower.flow();

#ifdef LOCAL_GRAPH_DEBUG
  std::cout << "LocalGraph::dump\n";
  for (auto& [get, sets] : getSetsMap) {
    std::cout << "GET\n" << get << " is influenced by\n";
    for (auto* set : sets) {
      std::cout << set << '\n';
    }
  }
  std::cout << "total locations: " << locations.size() << '\n';
#endif
}